

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void RawWrite(RawFD fd,char *buf,size_t len)

{
  ssize_t sVar1;
  int *piVar2;
  
  do {
    if (len == 0) {
      return;
    }
    while (sVar1 = write(fd,buf,len), sVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        return;
      }
    }
    buf = buf + sVar1;
    len = len - sVar1;
  } while (sVar1 != 0);
  return;
}

Assistant:

void RawWrite(RawFD fd, const char* buf, size_t len) {
  while (len > 0) {
    ssize_t r;
    NO_INTR(r = write(fd, buf, len));
    if (r <= 0) break;
    buf += r;
    len -= r;
  }
}